

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_token.c
# Opt level: O2

char * StringToken_GetValue(STRING_TOKEN_HANDLE token)

{
  char *pcVar1;
  LOGGER_LOG p_Var2;
  
  if (token == (STRING_TOKEN_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
                ,"StringToken_GetValue",0xe5,1,"Invalig argument (token is NULL)");
      return (char *)0x0;
    }
  }
  else {
    pcVar1 = token->token_start;
    if (pcVar1 != token->source + token->length) {
      if (pcVar1 == token->delimiter_start) {
        return (char *)0x0;
      }
      return pcVar1;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* StringToken_GetValue(STRING_TOKEN_HANDLE token)
{
    const char* result;

    // Codes_SRS_STRING_TOKENIZER_09_013: [ If token is NULL the function shall return NULL ]
    if (token == NULL)
    {
        LogError("Invalig argument (token is NULL)");
        result = NULL;
    }
    // Beyond the length of the source string.
    else if (token->token_start == (token->source + token->length))
    {
        result = NULL;
    }
    // Two delimiters side by side (empty token).
    else if (token->token_start == token->delimiter_start)
    {
        result = NULL;
    }
    else
    {
        // Codes_SRS_STRING_TOKENIZER_09_014: [ The function shall return the pointer to the position in source where the current token starts. ]
        result = token->token_start;
    }

    return result;
}